

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O0

int ibuf_add(ibuf *buf,void *data,size_t len)

{
  int iVar1;
  size_t in_RDX;
  ibuf *in_RSI;
  long in_RDI;
  int local_4;
  
  if ((*(ulong *)(in_RDI + 0x18) < *(long *)(in_RDI + 0x28) + in_RDX) &&
     (iVar1 = ibuf_realloc(in_RSI,in_RDX), iVar1 == -1)) {
    local_4 = -1;
  }
  else {
    memcpy((void *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0x28)),in_RSI,in_RDX);
    *(size_t *)(in_RDI + 0x28) = in_RDX + *(long *)(in_RDI + 0x28);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
ibuf_add(struct ibuf *buf, const void *data, size_t len)
{
	if (buf->wpos + len > buf->size)
		if (ibuf_realloc(buf, len) == -1)
			return (-1);

	memcpy(buf->buf + buf->wpos, data, len);
	buf->wpos += len;
	return (0);
}